

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall Model::Simulate(Model *this,int time_limit,double time_step,string *output)

{
  double time_stamp;
  SpeciesTracker *this_00;
  ofstream countfile;
  double local_268;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  this_00 = SpeciesTracker::Instance();
  Initialize(this);
  std::ofstream::ofstream((ostream *)&local_230,(string *)output,_S_trunc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"time\tspecies\tprotein\ttranscript\tribo_density\n",0x2d);
  local_268 = 0.0;
  while (time_stamp = (this->gillespie_).time_, time_stamp < (double)time_limit) {
    if (local_268 - time_stamp < 0.001) {
      SpeciesTracker::GatherCounts_abi_cxx11_(&local_250,this_00,time_stamp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      std::ostream::flush();
      local_268 = local_268 + time_step;
    }
    Gillespie::Iterate(&this->gillespie_);
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Simulation successful. Ignore any warnings that follow.",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _setbuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Model::Simulate(int time_limit, double time_step,
                     const std::string &output = "counts.tsv") {
  auto &tracker = SpeciesTracker::Instance();
  Initialize();
  // Set up file output streams
  std::ofstream countfile(output, std::ios::trunc);
  // Output header
  countfile << "time\tspecies\tprotein\ttranscript\tribo_density\n";
  double out_time = 0.0;
  while (gillespie_.time() < time_limit) {
    if ((out_time - gillespie_.time()) < 0.001) {
      countfile << tracker.GatherCounts(gillespie_.time());
      countfile.flush();
      out_time += time_step;
    }
    gillespie_.Iterate();
  }
  countfile.close();
  std::cout << "Simulation successful. Ignore any warnings that follow." << std::endl;
}